

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

char * __thiscall pybind11::error_already_set::what(error_already_set *this)

{
  element_type *this_00;
  char *pcVar1;
  undefined1 local_38 [8];
  error_scope scope;
  gil_scoped_acquire gil;
  error_already_set *this_local;
  
  gil_scoped_acquire::gil_scoped_acquire((gil_scoped_acquire *)&scope.trace);
  error_scope::error_scope((error_scope *)local_38);
  this_00 = std::
            __shared_ptr_access<pybind11::detail::error_fetch_and_normalize,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pybind11::detail::error_fetch_and_normalize,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_fetched_error);
  detail::error_fetch_and_normalize::error_string_abi_cxx11_(this_00);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  error_scope::~error_scope((error_scope *)local_38);
  gil_scoped_acquire::~gil_scoped_acquire((gil_scoped_acquire *)&scope.trace);
  return pcVar1;
}

Assistant:

inline const char *error_already_set::what() const noexcept {
    gil_scoped_acquire gil;
    error_scope scope;
    return m_fetched_error->error_string().c_str();
}